

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrunnable.h
# Opt level: O0

void * QRunnable::QGenericRunnable::Helper<std::function<void_()>_>::impl
                 (Op op,HelperBase *that,void *arg)

{
  void *in_RSI;
  int in_EDI;
  Helper<std::function<void_()>_> *_this;
  function<void_()> *in_stack_ffffffffffffffd0;
  
  if (in_EDI == 0) {
    QtPrivate::detail::StorageByValue<std::function<void_()>,_void>::object
              ((StorageByValue<std::function<void_()>,_void> *)((long)in_RSI + 8));
    std::function<void_()>::operator()(in_stack_ffffffffffffffd0);
  }
  else if ((in_EDI == 1) && (in_RSI != (void *)0x0)) {
    ~Helper((Helper<std::function<void_()>_> *)0x201fdb);
    operator_delete(in_RSI,0x28);
  }
  return (void *)0x0;
}

Assistant:

static void *impl(Op op, HelperBase *that, [[maybe_unused]] void *arg)
        {
            const auto _this = static_cast<Helper*>(that);
            switch (op) {
            case Op::Run:     _this->object()(); break;
            case Op::Destroy: delete _this; break;
            }
            return nullptr;
        }